

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCompare2VarCofsRev(word *pTruth,int nWords,int iVar,int Num1,int Num2)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int Offset2;
  int Offset1;
  int iStep;
  int i;
  word *pLimit;
  uint *pLimitU;
  uint *pTruthU;
  int shift;
  int w;
  word Cof2_1;
  word Cof1_1;
  word Cof2;
  word Cof1;
  int Num2_local;
  int Num1_local;
  int iVar_local;
  int nWords_local;
  word *pTruth_local;
  
  if ((Num1 < Num2) && (Num2 < 4)) {
    bVar5 = (byte)iVar;
    if (nWords == 1) {
      uVar3 = *pTruth >> ((char)Num1 * (char)(1 << (bVar5 & 0x1f)) & 0x3fU) & s_CMasks6[iVar];
      uVar4 = *pTruth >> ((char)Num2 * (char)(1 << (bVar5 & 0x1f)) & 0x3fU) & s_CMasks6[iVar];
      if (uVar3 == uVar4) {
        pTruth_local._4_4_ = 0;
      }
      else {
        pTruth_local._4_4_ = 1;
        if (uVar3 < uVar4) {
          pTruth_local._4_4_ = -1;
        }
      }
    }
    else if (iVar < 5) {
      for (pTruthU._4_4_ = nWords + -1; -1 < pTruthU._4_4_; pTruthU._4_4_ = pTruthU._4_4_ + -1) {
        cVar1 = (char)(1 << (bVar5 & 0x1f));
        uVar3 = pTruth[pTruthU._4_4_] >> ((char)Num1 * cVar1 & 0x3fU) & s_CMasks6[iVar];
        uVar4 = pTruth[pTruthU._4_4_] >> ((char)Num2 * cVar1 & 0x3fU) & s_CMasks6[iVar];
        if (uVar3 != uVar4) {
          if (uVar4 <= uVar3) {
            return 1;
          }
          return -1;
        }
      }
      pTruth_local._4_4_ = 0;
    }
    else if (iVar == 5) {
      pLimit = pTruth + nWords;
      if (nWords < 2) {
        __assert_fail("nWords >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                      ,0x102,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
      }
      do {
        pLimit = pLimit + -2;
        if (pLimit < pTruth) {
          return 0;
        }
      } while (*(int *)((long)pLimit + (long)Num1 * 4) == *(int *)((long)pLimit + (long)Num2 * 4));
      pTruth_local._4_4_ = 1;
      if (*(uint *)((long)pLimit + (long)Num1 * 4) < *(uint *)((long)pLimit + (long)Num2 * 4)) {
        pTruth_local._4_4_ = -1;
      }
    }
    else {
      iVar2 = Abc_TtWordNum(iVar);
      if (nWords < 4) {
        __assert_fail("nWords >= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                      ,0x10e,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
      }
      for (_iStep = pTruth + ((long)nWords - (long)(iVar2 << 2)); Offset1 = iVar2, pTruth <= _iStep;
          _iStep = _iStep + -(long)(iVar2 << 2)) {
        while (Offset1 = Offset1 + -1, -1 < Offset1) {
          if (_iStep[Offset1 + Num1 * iVar2] != _iStep[Offset1 + Num2 * iVar2]) {
            if (_iStep[Offset1 + Num2 * iVar2] <= _iStep[Offset1 + Num1 * iVar2]) {
              return 1;
            }
            return -1;
          }
        }
      }
      pTruth_local._4_4_ = 0;
    }
    return pTruth_local._4_4_;
  }
  __assert_fail("Num1 < Num2 && Num2 < 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                ,0xe8,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
}

Assistant:

static inline int Abc_TtCompare2VarCofsRev( word * pTruth, int nWords, int iVar, int Num1, int Num2 )
{
    assert( Num1 < Num2 && Num2 < 4 );
    if ( nWords == 1 )
    {
        word Cof1 = (pTruth[0] >> (Num1 * (1 << iVar))) & s_CMasks6[iVar];
        word Cof2 = (pTruth[0] >> (Num2 * (1 << iVar))) & s_CMasks6[iVar];
        if ( Cof1 != Cof2 )
            return Cof1 < Cof2 ? -1 : 1;
        return 0;
    }
	if ( iVar <= 4 )
	{
        word Cof1, Cof2;
		int w, shift = (1 << iVar);
		for ( w = nWords - 1; w >= 0; w-- )
        {
            Cof1 = (pTruth[w] >> Num1 * shift) & s_CMasks6[iVar];
            Cof2 = (pTruth[w] >> Num2 * shift) & s_CMasks6[iVar];
            if ( Cof1 != Cof2 )
                return Cof1 < Cof2 ? -1 : 1;
        }
        return 0;
	}
	if ( iVar == 5 )
	{
        unsigned * pTruthU = (unsigned *)pTruth;
        unsigned * pLimitU = (unsigned *)(pTruth + nWords);
        assert( nWords >= 2 );
		for ( pLimitU -= 4; pLimitU >= pTruthU; pLimitU -= 4 )
            if ( pLimitU[Num1] != pLimitU[Num2] )
                return pLimitU[Num1] < pLimitU[Num2] ? -1 : 1;
        return 0;
	}
	// if ( iVar > 5 )
	{
        word * pLimit = pTruth + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
        int Offset1 = Num1*iStep;
        int Offset2 = Num2*iStep;
        assert( nWords >= 4 );
		for ( pLimit -= 4*iStep; pLimit >= pTruth; pLimit -= 4*iStep )
			for ( i = iStep - 1; i >= 0; i-- )
                if ( pLimit[i + Offset1] != pLimit[i + Offset2] )
                    return pLimit[i + Offset1] < pLimit[i + Offset2] ? -1 : 1;
        return 0;
	}	
}